

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem_unix.c
# Opt level: O2

w_status w_vmem_uncommit(w_vmem *mem,void *addr,size_t size)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  int *piVar4;
  w_status wVar5;
  wp_vmem_trace_data *trace_data;
  
  iVar1 = w_mtx_lock(&wp_vmem_tracer_mtx);
  if (iVar1 != 0) {
    w_abort(-8);
  }
  wp_trace_pool_find_data
            (&trace_data,wp_vmem_tracer_inst.idx_pool,wp_vmem_tracer_inst.data_pool,0x400,8,mem);
  iVar1 = w_mtx_unlock(&wp_vmem_tracer_mtx);
  if (iVar1 != 0) {
    w_abort(-0xc);
  }
  pvVar2 = mem->addr;
  if (addr < pvVar2) {
    w_handle_failed_assertion
              ("(uintptr_t)addr >= (uintptr_t)mem->addr","w_vmem_uncommit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xdd);
    pvVar2 = mem->addr;
  }
  if (trace_data->size + (long)pvVar2 < (long)addr + size) {
    w_handle_failed_assertion
              ("(uintptr_t)addr + size <= (uintptr_t)mem->addr + trace_data->size","w_vmem_uncommit"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xe0);
    pvVar2 = mem->addr;
  }
  if (pvVar2 == (void *)0x0) {
    w_handle_failed_assertion
              ("mem->addr != NULL","w_vmem_uncommit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xe5);
  }
  if (addr == (void *)0x0) {
    w_handle_failed_assertion
              ("addr != NULL","w_vmem_uncommit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xe6);
  }
  if (size == 0) {
    w_handle_failed_assertion
              ("size > 0","w_vmem_uncommit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xe7);
  }
  sVar3 = w_get_alloc_granularity();
  if (size % sVar3 != 0) {
    w_handle_failed_assertion
              ("size % w_get_commit_granularity() == 0","w_vmem_uncommit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xe8);
  }
  wVar5 = W_SUCCESS;
  iVar1 = mprotect(addr,size,0);
  if (iVar1 == 0) {
    iVar1 = madvise(addr,size,4);
    if (iVar1 != 0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      wVar5 = W_SUCCESS;
      wp_log(W_LOG_LVL_WARNING,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,0xf9,"failed to uncommit %zu bytes of virtual memory at %p\n",size,addr);
      wp_log_system_error(W_LOG_LVL_ALL,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                          ,0xfa,iVar1);
    }
  }
  else {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    wp_log(W_LOG_LVL_ERROR,
           "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
           ,0xef,"failed to uncommit %zu bytes of virtual memory at %p\n",size,addr);
    wp_log_system_error(W_LOG_LVL_ALL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                        ,0xf0,iVar1);
    wVar5 = W_ERROR_ALLOC_FAILED;
  }
  return wVar5;
}

Assistant:

enum w_status
w_vmem_uncommit(
    struct w_vmem *mem,
    void *addr,
    size_t size
)
{
#if W_TRACING(ENABLED)
    {
        struct wp_vmem_trace_data *trace_data;

        W_TRACER_FIND_DATA(wp_vmem_tracer, &trace_data, mem);
        W_ASSERT(
            (uintptr_t)addr >= (uintptr_t)mem->addr
        );
        W_ASSERT(
            (uintptr_t)addr + size <= (uintptr_t)mem->addr + trace_data->size
        );
    }
#endif

    W_ASSERT(mem != NULL);
    W_ASSERT(mem->addr != NULL);
    W_ASSERT(addr != NULL);
    W_ASSERT(size > 0);
    W_ASSERT(size % w_get_commit_granularity() == 0);

    if (mprotect(addr, size, PROT_NONE) != 0)
    {
        int error;

        error = errno;
        W_LOG_ERROR(WP_VMEM_GET_ERROR_MSG("uncommit"), size, addr);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
        return W_ERROR_ALLOC_FAILED;
    }

    if (madvise(addr, size, MADV_DONTNEED) != 0)
    {
        int error;

        error = errno;
        W_LOG_WARNING(WP_VMEM_GET_ERROR_MSG("uncommit"), size, addr);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
    }

    return W_SUCCESS;
}